

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall
cmCTestTestHandler::WriteTestResultHeader
          (cmCTestTestHandler *this,cmXMLWriter *xml,cmCTestTestResult *result)

{
  char (*value) [7];
  char *pcVar1;
  string testPath;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Test",(allocator<char> *)&local_88);
  cmXMLWriter::StartElement(xml,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pcVar1 = "failed";
  if (result->Status == 0) {
    pcVar1 = "notrun";
  }
  value = (char (*) [7])0x5fc7f8;
  if (result->Status != 9) {
    value = (char (*) [7])pcVar1;
  }
  cmXMLWriter::Attribute<char[7]>(xml,"Status",value);
  std::operator+(&local_88,&result->Path,"/");
  std::operator+(&local_48,&local_88,&result->Name);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Name",(allocator<char> *)&local_68);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_88,&result->Name);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Path",&local_89);
  cmCTest::GetShortPathToFile(&local_68,(this->super_cmCTestGenericHandler).CTest,&result->Path);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_88,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"FullName",&local_89);
  cmCTest::GetShortPathToFile(&local_68,(this->super_cmCTestGenericHandler).CTest,&local_48);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_88,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"FullCommandLine",(allocator<char> *)&local_68);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_88,&result->FullCommandLine);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cmCTestTestHandler::WriteTestResultHeader(cmXMLWriter& xml,
                                               cmCTestTestResult const& result)
{
  xml.StartElement("Test");
  if (result.Status == cmCTestTestHandler::COMPLETED) {
    xml.Attribute("Status", "passed");
  } else if (result.Status == cmCTestTestHandler::NOT_RUN) {
    xml.Attribute("Status", "notrun");
  } else {
    xml.Attribute("Status", "failed");
  }
  std::string testPath = result.Path + "/" + result.Name;
  xml.Element("Name", result.Name);
  xml.Element("Path", this->CTest->GetShortPathToFile(result.Path));
  xml.Element("FullName", this->CTest->GetShortPathToFile(testPath));
  xml.Element("FullCommandLine", result.FullCommandLine);
}